

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O2

void __thiscall
lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::setup
          (HungarianBranching<lineage::heuristics::PartitionGraph> *this)

{
  PartitionGraph *this_00;
  size_t sVar1;
  value_type_conflict4 local_21;
  size_t local_20;
  
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->partitions_,
           ((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_)->data_->
           problemGraph->numberOfFrames_);
  local_20 = 0;
  while( true ) {
    this_00 = (this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_;
    if ((ulong)((long)(this_00->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                      vertices_.
                      super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                      vertices_.
                      super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) <= local_20) break;
    sVar1 = PartitionGraph::frameOfPartition(this_00,local_20);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)
               ((this->partitions_).
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + sVar1),&local_20);
    local_20 = local_20 + 1;
  }
  local_21 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->solution_,
             (long)(this_00->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                   super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this_00->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                   super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_21);
  return;
}

Assistant:

inline void
HungarianBranching<GRAPH>::setup()
{
    partitions_.resize(this->graph_.data_.problemGraph.numberOfFrames());
    for (size_t partitionIdx = 0;
         partitionIdx < this->graph_.numberOfVertices(); ++partitionIdx) {

        try {
            const auto& frame = this->graph_.frameOfPartition(partitionIdx);
            partitions_[frame].emplace_back(partitionIdx);
        } catch (std::runtime_error&) {
            continue; // empty partitions are ignored.
        }
    }

    // initialize solution
    solution_.resize(this->graph_.numberOfEdges(), 0);
}